

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

void married(nng_pipe p,nng_pipe_ev ev,void *arg)

{
  nng_socket nVar1;
  int iVar2;
  
  nng_mtx_lock(*arg);
  nVar1 = nng_pipe_socket(p);
  iVar2 = nng_socket_id(nVar1);
  if (iVar2 == *(int *)((long)arg + 0x10)) {
    *(int *)((long)arg + 0x18) = *(int *)((long)arg + 0x18) + 1;
    *(uint32_t *)((long)arg + 0x20) = p.id;
  }
  else {
    nVar1 = nng_pipe_socket(p);
    iVar2 = nng_socket_id(nVar1);
    if (iVar2 == *(int *)((long)arg + 0x14)) {
      *(int *)((long)arg + 0x1c) = *(int *)((long)arg + 0x1c) + 1;
      *(uint32_t *)((long)arg + 0x24) = p.id;
    }
  }
  nng_cv_wake(*(nng_cv **)((long)arg + 8));
  nng_mtx_unlock(*arg);
  return;
}

Assistant:

static void
married(nng_pipe p, nng_pipe_ev ev, void *arg)
{
	struct marriage_notice *notice = arg;
	(void) ev;

	nng_mtx_lock(notice->mx);
	if (nng_socket_id(nng_pipe_socket(p)) == notice->s1) {
		notice->cnt1++;
		notice->p1 = p;
	} else if (nng_socket_id(nng_pipe_socket(p)) == notice->s2) {
		notice->cnt2++;
		notice->p2 = p;
	}
	nng_cv_wake(notice->cv);
	nng_mtx_unlock(notice->mx);
}